

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_free_all_(map_base_t *m)

{
  undefined8 *puVar1;
  map_iter_t mVar2;
  void **res;
  map_iter_t iter;
  char *key;
  map_base_t *m_local;
  
  mVar2 = map_iter_();
  iter._0_8_ = mVar2.node;
  res._0_4_ = mVar2.bucketidx;
  while (iter.node = (map_node_t *)map_next_(m,(map_iter_t *)&res), iter.node != (map_node_t *)0x0)
  {
    puVar1 = (undefined8 *)map_get_(m,(char *)iter.node);
    if (puVar1 != (undefined8 *)0x0) {
      free((void *)*puVar1);
    }
  }
  return;
}

Assistant:

void map_free_all_(map_base_t *m) {
  const char *key;
  map_iter_t iter = map_iter(m);

  while ((key = map_next_(m, &iter))) {
    void **res = map_get_(m, key);
    if (res != NULL)
      free(*res);
  }
}